

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeSerializer.cpp
# Opt level: O0

uint32 __thiscall
Js::ByteCodeBufferBuilder::AddSlotArrayDebuggerScopes
          (ByteCodeBufferBuilder *this,BufferBuilderList *builder,FunctionBody *function,
          uint debuggerScopeSlotArraySize)

{
  DebuggerScope *this_00;
  code *pcVar1;
  bool bVar2;
  uint uVar3;
  uint32 uVar4;
  uint32 uVar5;
  uint32 uVar6;
  undefined4 *puVar7;
  ScopeObjectChain *pSVar8;
  List<Js::DebuggerScope_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer> *pLVar9;
  WriteBarrierPtr *this_01;
  DebuggerScope **ppDVar10;
  List<Js::DebuggerScopeProperty,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
  *this_02;
  uint local_58;
  int propertiesCount;
  DebuggerScope *debuggerScope;
  uint i;
  uint slotArrayCount;
  uint32 size;
  uint debuggerScopeSlotArraySize_local;
  FunctionBody *function_local;
  BufferBuilderList *builder_local;
  ByteCodeBufferBuilder *this_local;
  
  if (function == (FunctionBody *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeSerializer.cpp"
                                ,0x6fa,"(function)","function");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 0;
  }
  pSVar8 = FunctionBody::GetScopeObjectChain(function);
  if ((pSVar8 == (ScopeObjectChain *)0x0) || (debuggerScopeSlotArraySize == 0)) {
    this_local._4_4_ = 0;
  }
  else {
    i = 0;
    debuggerScope._4_4_ = 0;
    debuggerScope._0_4_ = 0;
    while( true ) {
      pSVar8 = FunctionBody::GetScopeObjectChain(function);
      pLVar9 = Memory::
               WriteBarrierPtr<JsUtil::List<Js::DebuggerScope_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>_>
               ::operator->(&pSVar8->pScopeChain);
      uVar3 = JsUtil::ReadOnlyList<Js::DebuggerScope_*,_Memory::Recycler,_DefaultComparer>::Count
                        (&pLVar9->
                          super_ReadOnlyList<Js::DebuggerScope_*,_Memory::Recycler,_DefaultComparer>
                        );
      if (uVar3 <= (uint)debuggerScope) break;
      pSVar8 = FunctionBody::GetScopeObjectChain(function);
      pLVar9 = Memory::
               WriteBarrierPtr<JsUtil::List<Js::DebuggerScope_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>_>
               ::operator->(&pSVar8->pScopeChain);
      this_01 = (WriteBarrierPtr *)
                JsUtil::
                List<Js::DebuggerScope_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                ::Item(pLVar9,(uint)debuggerScope);
      ppDVar10 = Memory::WriteBarrierPtr::operator_cast_to_DebuggerScope__(this_01);
      this_00 = *ppDVar10;
      bVar2 = DebuggerScope::IsSlotScope(this_00);
      if (bVar2) {
        uVar4 = PrependInt32(this,builder,L"SlotArrayDebuggerScope",(uint)debuggerScope,
                             (BufferBuilderInt32 **)0x0);
        bVar2 = DebuggerScope::HasProperties(this_00);
        if (bVar2) {
          this_02 = Memory::
                    WriteBarrierPtr<JsUtil::List<Js::DebuggerScopeProperty,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>_>
                    ::operator->(&this_00->scopeProperties);
          local_58 = JsUtil::
                     ReadOnlyList<Js::DebuggerScopeProperty,_Memory::Recycler,_DefaultComparer>::
                     Count(&this_02->
                            super_ReadOnlyList<Js::DebuggerScopeProperty,_Memory::Recycler,_DefaultComparer>
                          );
        }
        else {
          local_58 = 0;
        }
        uVar5 = PrependInt32(this,builder,L"Debugger Scope Slot Array Property Count",local_58,
                             (BufferBuilderInt32 **)0x0);
        uVar6 = AddSlotArrayDebuggerScopeProperties(this,builder,this_00,local_58);
        i = uVar6 + uVar5 + uVar4 + i;
        debuggerScope._4_4_ = debuggerScope._4_4_ + 1;
      }
      debuggerScope._0_4_ = (uint)debuggerScope + 1;
    }
    if (debuggerScopeSlotArraySize != debuggerScope._4_4_) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar7 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeSerializer.cpp"
                                  ,0x716,"(debuggerScopeSlotArraySize == slotArrayCount)",
                                  "debuggerScopeSlotArraySize == slotArrayCount");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar7 = 0;
    }
    this_local._4_4_ = i;
  }
  return this_local._4_4_;
}

Assistant:

uint32 AddSlotArrayDebuggerScopes(BufferBuilderList & builder, FunctionBody* function, uint debuggerScopeSlotArraySize)
    {
        Assert(function);
        if (function->GetScopeObjectChain() == nullptr || debuggerScopeSlotArraySize == 0)
        {
            return 0u;
        }

        uint32 size = 0u;

#ifdef BYTE_CODE_MAGIC_CONSTANTS
        size += PrependInt32(builder, _u("Start SlotArrayDebuggerScopes"), magicStartOfDebuggerScopes);
#endif // BYTE_CODE_MAGIC_CONSTANTS

        uint slotArrayCount = 0;
        for (uint i = 0u; i < static_cast<uint>(function->GetScopeObjectChain()->pScopeChain->Count()); ++i)
        {
            DebuggerScope* debuggerScope = function->GetScopeObjectChain()->pScopeChain->Item(i);
            if (debuggerScope->IsSlotScope())
            {
                // Only add slot scope debugger scopes (store the index of the scope).
                size += PrependInt32(builder, _u("SlotArrayDebuggerScope"), i);

                // Store the count of properties for the scope.
                int propertiesCount = debuggerScope->HasProperties() ? debuggerScope->scopeProperties->Count() : 0u;
                size += PrependInt32(builder, _u("Debugger Scope Slot Array Property Count"), propertiesCount);
                size += AddSlotArrayDebuggerScopeProperties(builder, debuggerScope, propertiesCount);
                slotArrayCount++;
            }
        }
        Assert(debuggerScopeSlotArraySize == slotArrayCount);

#ifdef BYTE_CODE_MAGIC_CONSTANTS
        size += PrependInt32(builder, _u("End SlotArrayDebuggerScopes"), magicEndOfDebuggerScopes);
#endif // BYTE_CODE_MAGIC_CONSTANTS

        return size;
    }